

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_fkhash_nlm.hpp
# Opt level: O0

void __thiscall
poplar::plain_fkhash_nlm<int>::show_stats(plain_fkhash_nlm<int> *this,ostream *os,int n)

{
  ostream *os_00;
  string *in_RSI;
  string indent;
  char (*in_stack_ffffffffffffff78) [17];
  char *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *indent_00;
  ostream *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  show_stat<char[17]>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78);
  indent_00 = local_10;
  os_00 = (ostream *)size((plain_fkhash_nlm<int> *)0x21cd1b);
  show_stat<unsigned_long>
            (os_00,indent_00,in_stack_ffffffffffffff80,(unsigned_long *)in_stack_ffffffffffffff78);
  alloc_bytes((plain_fkhash_nlm<int> *)local_10);
  show_stat<unsigned_long>
            (os_00,indent_00,(char *)local_10,(unsigned_long *)in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "plain_fkhash_nlm");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "max_length", max_length_);
        show_stat(os, indent, "ave_length", double(sum_length_) / size());
#endif
    }